

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O1

void libtorrent::aux::delete_files
               (file_storage *fs,string *save_path,string *part_file_name,remove_flags_t options,
               storage_error *ec)

{
  storage_error *psVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  undefined7 in_register_00000009;
  ulong uVar8;
  file_index_t index;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string_view lhs;
  string_view lhs_00;
  string_view lhs_01;
  string_view rhs;
  string_view rhs_00;
  string_view rhs_01;
  string fp;
  string p;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  string bp;
  undefined1 local_108 [4];
  uint uStack_104;
  error_category *peStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  uint local_c4;
  storage_error *local_c0;
  string local_b8;
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  _Rb_tree_node_base *local_78;
  size_t local_70;
  string local_68;
  string *local_48;
  file_storage *local_40;
  ulong local_38;
  
  uVar8 = CONCAT71(in_register_00000009,options.m_val);
  if ((options.m_val & 1) != 0) {
    local_c4 = (uint)uVar8;
    local_90._16_8_ = local_90;
    local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
    local_90._8_8_ = (_Base_ptr)0x0;
    local_70 = 0;
    local_c0 = ec;
    local_78 = (_Rb_tree_node_base *)local_90._16_8_;
    local_48 = part_file_name;
    iVar5 = file_storage::file_range(fs);
    local_38 = (ulong)iVar5 >> 0x20;
    if (iVar5._begin.m_val.m_val != iVar5._end.m_val.m_val) {
      local_40 = fs;
      do {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
        index.m_val = (int)iVar5._begin.m_val;
        file_storage::file_path((string *)local_108,fs,index,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        bVar3 = file_storage::file_absolute_path(fs,index);
        if (bVar3) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,CONCAT44(uStack_104,local_108),
                     (long)&peStack_100->_vptr_error_category + CONCAT44(uStack_104,local_108));
        }
        else {
          rhs._M_len._4_4_ = uStack_104;
          rhs._M_len._0_4_ = local_108;
          lhs._M_str = (char *)peStack_100;
          lhs._M_len = (size_t)(save_path->_M_dataplus)._M_p;
          rhs._M_str = (char *)part_file_name;
          combine_path_abi_cxx11_(&local_e8,(libtorrent *)save_path->_M_string_length,lhs,rhs);
          parent_path(&local_68,(string *)local_108);
          do {
            if ((char *)local_68._M_string_length == (char *)0x0) break;
            lhs_00._M_str = (char *)local_68._M_string_length;
            lhs_00._M_len = (size_t)(save_path->_M_dataplus)._M_p;
            rhs_00._M_str = (char *)part_file_name;
            rhs_00._M_len = (size_t)local_68._M_dataplus._M_p;
            combine_path_abi_cxx11_
                      (&local_b8,(libtorrent *)save_path->_M_string_length,lhs_00,rhs_00);
            pVar9 = ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)local_98,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            parent_path(&local_b8,&local_68);
            ::std::__cxx11::string::operator=((string *)&local_68,(string *)&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          } while (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
        psVar1 = local_c0;
        anon_unknown_25::delete_one_file(&local_e8,&local_c0->ec);
        if ((psVar1->ec).val_ != 0) {
          *(short *)&psVar1->field_0x10 = (short)iVar5._begin.m_val;
          psVar1->field_0x12 = iVar5._begin.m_val._2_1_;
          psVar1->operation = file_remove;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        fs = local_40;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_104,local_108) != &local_f8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_104,local_108),local_f8._M_allocated_capacity + 1);
        }
        iVar5._begin.m_val = index.m_val + 1;
        iVar5._end.m_val = 0;
      } while (iVar5._begin.m_val != (uint)local_38);
    }
    uVar2 = local_90._16_8_;
    ec = local_c0;
    for (p_Var7 = (_Rb_tree_node_base *)local_90; p_Var7 != (_Rb_tree_node_base *)uVar2;
        p_Var7 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var7)) {
      local_108 = (undefined1  [4])0x0;
      uStack_104 = uStack_104 & 0xffffff00;
      peStack_100 = &boost::system::detail::cat_holder<void>::system_category_instance.
                     super_error_category;
      lVar6 = ::std::_Rb_tree_decrement(p_Var7);
      anon_unknown_25::delete_one_file((string *)(lVar6 + 0x20),(error_code *)local_108);
      if ((uStack_104._0_1_ == true) && ((ec->ec).val_ == 0)) {
        ec->field_0x12 = 0xff;
        *(undefined2 *)&ec->field_0x10 = 0xffff;
        (ec->ec).val_ = (int)local_108;
        (ec->ec).failed_ = (bool)(char)uStack_104;
        *(int3 *)&(ec->ec).field_0x5 = (int3)(uStack_104 >> 8);
        (ec->ec).cat_ = peStack_100;
        ec->operation = file_remove;
      }
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
    uVar8 = (ulong)local_c4;
    part_file_name = local_48;
  }
  if ((uVar8 & 3) != 0) {
    local_108 = (undefined1  [4])0x0;
    uStack_104 = uStack_104 & 0xffffff00;
    peStack_100 = &boost::system::detail::cat_holder<void>::system_category_instance.
                   super_error_category;
    lhs_01._M_str = (char *)part_file_name->_M_string_length;
    lhs_01._M_len = (size_t)(save_path->_M_dataplus)._M_p;
    rhs_01._M_str = (char *)part_file_name;
    rhs_01._M_len = (size_t)(part_file_name->_M_dataplus)._M_p;
    combine_path_abi_cxx11_
              ((string *)local_98,(libtorrent *)save_path->_M_string_length,lhs_01,rhs_01);
    remove((libtorrent *)local_98,local_108);
    if (local_98 != (undefined1  [8])(local_90 + 8)) {
      operator_delete((void *)local_98,(ulong)(local_90._8_8_ + 1));
    }
    if (uStack_104._0_1_ == true) {
      local_98 = (undefined1  [8])0x100000002;
      local_90._0_8_ = &boost::system::detail::cat_holder<void>::generic_category_instance;
      iVar4 = (*peStack_100->_vptr_error_category[2])(peStack_100,(ulong)(uint)local_108);
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*((error_category *)local_90._0_8_)->_vptr_error_category[3])
                            (local_90._0_8_,local_108,(ulong)local_98 & 0xffffffff),
         (char)iVar4 == '\0')) {
        ec->field_0x12 = 0xff;
        *(undefined2 *)&ec->field_0x10 = 0xffff;
        (ec->ec).val_ = (int)local_108;
        (ec->ec).failed_ = (bool)(char)uStack_104;
        *(int3 *)&(ec->ec).field_0x5 = (int3)(uStack_104 >> 8);
        (ec->ec).cat_ = peStack_100;
        ec->operation = file_remove;
      }
    }
  }
  return;
}

Assistant:

void delete_files(file_storage const& fs, std::string const& save_path
		, std::string const& part_file_name, remove_flags_t const options, storage_error& ec)
	{
		if (options & session::delete_files)
		{
			// delete the files from disk
			std::set<std::string> directories;
			using iter_t = std::set<std::string>::iterator;
			for (auto const i : fs.file_range())
			{
				std::string const fp = fs.file_path(i);
				bool const complete = fs.file_absolute_path(i);
				std::string const p = complete ? fp : combine_path(save_path, fp);
				if (!complete)
				{
					std::string bp = parent_path(fp);
					std::pair<iter_t, bool> ret;
					ret.second = true;
					while (ret.second && !bp.empty())
					{
						ret = directories.insert(combine_path(save_path, bp));
						bp = parent_path(bp);
					}
				}
				delete_one_file(p, ec.ec);
				if (ec) { ec.file(i); ec.operation = operation_t::file_remove; }
			}

			// remove the directories. Reverse order to delete
			// subdirectories first

			for (auto i = directories.rbegin()
				, end(directories.rend()); i != end; ++i)
			{
				error_code error;
				delete_one_file(*i, error);
				if (error && !ec)
				{
					ec.file(file_index_t(-1));
					ec.ec = error;
					ec.operation = operation_t::file_remove;
				}
			}
		}

		// when we're deleting "files", we also delete the part file
		if ((options & session::delete_partfile)
			|| (options & session::delete_files))
		{
			error_code error;
			remove(combine_path(save_path, part_file_name), error);
			if (error && error != boost::system::errc::no_such_file_or_directory)
			{
				ec.file(file_index_t(-1));
				ec.ec = error;
				ec.operation = operation_t::file_remove;
			}
		}
	}